

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.h
# Opt level: O0

SQObjectPtr * __thiscall SQObjectPtr::operator=(SQObjectPtr *this,bool b)

{
  SQTable *pSVar1;
  SQUnsignedInteger SVar2;
  byte in_SIL;
  SQObjectPtr *in_RDI;
  
  if ((((in_RDI->super_SQObject)._type & 0x8000000) != 0) &&
     (pSVar1 = (in_RDI->super_SQObject)._unVal.pTable,
     SVar2 = (pSVar1->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef - 1,
     (pSVar1->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef = SVar2, SVar2 == 0))
  {
    (*(((in_RDI->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
      super_SQRefCounted._vptr_SQRefCounted[2])();
  }
  (in_RDI->super_SQObject)._unVal.pTable = (SQTable *)0x0;
  (in_RDI->super_SQObject)._type = OT_BOOL;
  (in_RDI->super_SQObject)._unVal = (SQObjectValue)(long)(int)(uint)((in_SIL & 1) != 0);
  return in_RDI;
}

Assistant:

inline SQObjectPtr& operator=(bool b)
    {
        __Release(_type,_unVal);
        SQ_OBJECT_RAWINIT()
        _type = OT_BOOL;
        _unVal.nInteger = b?1:0;
        return *this;
    }